

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

void Js::JavascriptPromise::InitializePromise
               (JavascriptPromise *promise,JavascriptPromiseResolveOrRejectFunction **resolve,
               JavascriptPromiseResolveOrRejectFunction **reject,ScriptContext *scriptContext)

{
  code *pcVar1;
  JavascriptLibrary *this;
  PromiseStatus PVar2;
  bool bVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *this_00;
  JavascriptPromiseResolveOrRejectFunction *pJVar6;
  TrackAllocData local_a0;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *local_78;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyResolvedRecord;
  undefined8 local_68;
  TrackAllocData local_60;
  JavascriptLibrary *local_38;
  JavascriptLibrary *library;
  Recycler *recycler;
  ScriptContext *scriptContext_local;
  JavascriptPromiseResolveOrRejectFunction **reject_local;
  JavascriptPromiseResolveOrRejectFunction **resolve_local;
  JavascriptPromise *promise_local;
  
  recycler = (Recycler *)scriptContext;
  scriptContext_local = (ScriptContext *)reject;
  reject_local = resolve;
  resolve_local = (JavascriptPromiseResolveOrRejectFunction **)promise;
  PVar2 = GetStatus(promise);
  if (PVar2 != PromiseStatusCode_Undefined) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x67,"(promise->GetStatus() == PromiseStatusCode_Undefined)",
                                "promise->GetStatus() == PromiseStatusCode_Undefined");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (reject_local == (JavascriptPromiseResolveOrRejectFunction **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x68,"(resolve)","resolve");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (scriptContext_local == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x69,"(reject)","reject");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  library = (JavascriptLibrary *)ScriptContext::GetRecycler((ScriptContext *)recycler);
  local_38 = ScriptContext::GetLibrary((ScriptContext *)recycler);
  SetStatus((JavascriptPromise *)resolve_local,PromiseStatusCode_Unresolved);
  this = library;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,
             (type_info *)
             &SList<Js::JavascriptPromiseReactionPair,Memory::Recycler,RealCount>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
             ,0x70);
  pRVar5 = Memory::Recycler::TrackAllocInfo((Recycler *)this,&local_60);
  alreadyResolvedRecord =
       (JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *)
       Memory::Recycler::AllocInlined;
  local_68 = 0;
  this_00 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
            new<Memory::Recycler>(0x18,pRVar5,0x43c4b0);
  SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::SList
            (this_00,(Recycler *)library);
  Memory::WriteBarrierPtr<SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>_>::
  operator=((WriteBarrierPtr<SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>_>
             *)(resolve_local + 5),this_00);
  pRVar5 = ScriptContext::GetRecycler((ScriptContext *)recycler);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_a0,
             (type_info *)&JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper::typeinfo,
             0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
             ,0x72);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_a0);
  local_78 = (JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *)
             new<Memory::Recycler>(1,pRVar5,0x744a10);
  local_78->alreadyResolved = false;
  pJVar6 = JavascriptLibrary::CreatePromiseResolveOrRejectFunction
                     (local_38,EntryResolveOrRejectFunction,(JavascriptPromise *)resolve_local,false
                      ,local_78);
  *reject_local = pJVar6;
  pJVar6 = JavascriptLibrary::CreatePromiseResolveOrRejectFunction
                     (local_38,EntryResolveOrRejectFunction,(JavascriptPromise *)resolve_local,true,
                      local_78);
  (scriptContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo = (_func_int **)pJVar6;
  return;
}

Assistant:

void JavascriptPromise::InitializePromise(JavascriptPromise* promise, JavascriptPromiseResolveOrRejectFunction** resolve, JavascriptPromiseResolveOrRejectFunction** reject, ScriptContext* scriptContext)
    {
        Assert(promise->GetStatus() == PromiseStatusCode_Undefined);
        Assert(resolve);
        Assert(reject);

        Recycler* recycler = scriptContext->GetRecycler();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        promise->SetStatus(PromiseStatusCode_Unresolved);

        promise->reactions = RecyclerNew(recycler, JavascriptPromiseReactionList, recycler);

        JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyResolvedRecord = RecyclerNewStructZ(scriptContext->GetRecycler(), JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper);
        alreadyResolvedRecord->alreadyResolved = false;

        *resolve = library->CreatePromiseResolveOrRejectFunction(EntryResolveOrRejectFunction, promise, false, alreadyResolvedRecord);
        *reject = library->CreatePromiseResolveOrRejectFunction(EntryResolveOrRejectFunction, promise, true, alreadyResolvedRecord);
    }